

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall testing::TestCase::UnshuffleTests(TestCase *this)

{
  size_type sVar1;
  reference pvVar2;
  long in_RDI;
  size_t i;
  undefined8 local_10;
  
  local_10 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48));
    if (sVar1 <= local_10) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x48),local_10);
    *pvVar2 = (value_type)local_10;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

void TestCase::UnshuffleTests() {
  for (size_t i = 0; i < test_indices_.size(); i++) {
    test_indices_[i] = static_cast<int>(i);
  }
}